

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O3

void __thiscall QHexView::copyAs(QHexView *this,CopyMode mode)

{
  char cVar1;
  QHexDocument *pQVar2;
  bool bVar3;
  void *__buf;
  char *pcVar4;
  ulong uVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QString t;
  QString hexchar;
  QByteArray bytes;
  QArrayData *local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  QArrayData *local_d8;
  undefined8 uStack_d0;
  long local_c8;
  undefined1 local_b8 [16];
  QHexBuffer *local_a8;
  QArrayData *local_a0 [3];
  QArrayData *local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  uint local_6c;
  QHexView *local_68;
  undefined8 local_60;
  QArrayData *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  ulong local_38;
  
  local_60 = QGuiApplication::clipboard();
  bVar3 = QHexCursor::hasSelection(this->m_hexcursor);
  if (bVar3) {
    QHexCursor::selectedBytes((QByteArray *)local_b8,this->m_hexcursor);
  }
  else {
    pQVar2 = this->m_hexdocument;
    __buf = (void *)QHexCursor::offset(this->m_hexcursor);
    QHexDocument::read((QHexDocument *)local_b8,(int)pQVar2,__buf,1);
  }
  local_68 = this;
  if (mode - HexArraySquare < 2) {
    local_d8 = (QArrayData *)0x0;
    uStack_d0 = 0;
    local_c8 = 0;
    local_38 = (ulong)mode;
    if (((((QArrayData *)local_b8._0_8_ == (QArrayData *)0x0) ||
         (1 < (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i)) &&
        (QByteArray::reallocData((longlong)local_b8,(AllocationOption)local_a8),
        (QArrayData *)local_b8._0_8_ == (QArrayData *)0x0)) ||
       (pcVar4 = (char *)local_b8._8_8_,
       1 < (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i)) {
      pcVar4 = (char *)local_b8._8_8_;
      QByteArray::reallocData((longlong)local_b8,(AllocationOption)local_a8);
    }
    if (pcVar4 != (char *)(local_b8._8_8_ + (long)local_a8)) {
      local_6c = 0;
      do {
        cVar1 = *pcVar4;
        if (local_c8 != 0) {
          QVar10.m_data = (storage_type *)0x2;
          QVar10.m_size = (qsizetype)&local_f8;
          QString::fromUtf8(QVar10);
          QString::append((QString *)&local_d8);
          if (local_f8 != (QArrayData *)0x0) {
            LOCK();
            (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_f8,2,8);
            }
          }
          if (((local_68->m_options).copybreak == true) &&
             (local_6c = local_6c + 1, local_6c % (local_68->m_options).linelength == 0)) {
            QVar12.m_data = (storage_type *)0x1;
            QVar12.m_size = (qsizetype)&local_f8;
            QString::fromUtf8(QVar12);
            QString::append((QString *)&local_d8);
            if (local_f8 != (QArrayData *)0x0) {
              LOCK();
              (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_f8,2,8);
              }
            }
          }
        }
        QString::number((uint)&local_88,(int)cVar1);
        QString::toUpper_helper((QString *)local_a0);
        QVar11.m_data = (storage_type *)0x2;
        QVar11.m_size = (qsizetype)&local_f8;
        QString::fromUtf8(QVar11);
        QString::append((QString *)&local_f8);
        QString::append((QString *)&local_d8);
        if (local_f8 != (QArrayData *)0x0) {
          LOCK();
          (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_f8,2,8);
          }
        }
        if (local_a0[0] != (QArrayData *)0x0) {
          LOCK();
          (local_a0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_a0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_a0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_a0[0],2,8);
          }
        }
        if (local_88 != (QArrayData *)0x0) {
          LOCK();
          (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_88,2,8);
          }
        }
        pcVar4 = pcVar4 + 1;
      } while (pcVar4 != (char *)(local_b8._8_8_ + (long)local_a8));
    }
    QVar13.m_data = (storage_type *)0x4;
    QVar13.m_size = (qsizetype)&local_f8;
    QString::fromUtf8(QVar13);
    local_88 = local_f8;
    uStack_80 = uStack_f0;
    local_78 = local_e8;
    QString::arg((QString *)local_a0,(int)&local_88,(QChar)(char16_t)&local_d8);
    QClipboard::setText(local_60,local_a0,0);
  }
  else {
    if (mode != HexArrayChar) {
      local_d8 = (QArrayData *)0x0;
      uStack_d0 = 0;
      local_c8 = 0;
      if (0 < (long)local_a8) {
        uVar5 = 0;
        do {
          if ((int)((uVar5 & 0xffffffff) % (ulong)(local_68->m_options).grouplength) == 0) {
            if (local_c8 != 0) {
              QVar7.m_data = (storage_type *)0x2;
              QVar7.m_size = (qsizetype)&local_f8;
              QString::fromUtf8(QVar7);
              QString::append((QString *)&local_d8);
              if (local_f8 != (QArrayData *)0x0) {
                LOCK();
                (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_f8,2,8);
                }
              }
              if (((local_68->m_options).copybreak == true) &&
                 ((int)((uVar5 & 0xffffffff) % (ulong)(local_68->m_options).linelength) == 0)) {
                QVar9.m_data = (storage_type *)0x1;
                QVar9.m_size = (qsizetype)&local_f8;
                QString::fromUtf8(QVar9);
                QString::append((QString *)&local_d8);
                if (local_f8 != (QArrayData *)0x0) {
                  LOCK();
                  (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
                       (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(local_f8,2,8);
                  }
                }
              }
            }
            QVar8.m_data = (storage_type *)0x2;
            QVar8.m_size = (qsizetype)&local_f8;
            QString::fromUtf8(QVar8);
            QString::append((QString *)&local_d8);
            if (local_f8 != (QArrayData *)0x0) {
              LOCK();
              (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_f8,2,8);
              }
            }
          }
          QVar6.m_data = (storage_type *)0x2;
          QVar6.m_size = (qsizetype)&local_f8;
          QString::fromUtf8(QVar6);
          local_58 = local_f8;
          uStack_50 = uStack_f0;
          local_48 = local_e8;
          if (((QArrayData *)local_b8._0_8_ == (QArrayData *)0x0) ||
             (1 < (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i)) {
            QByteArray::reallocData((longlong)local_b8,(AllocationOption)local_a8);
          }
          QString::arg((ulonglong)&local_88,(int)&local_58,(int)*(char *)(local_b8._8_8_ + uVar5),
                       (QChar)0x2);
          QString::toUpper_helper((QString *)local_a0);
          QString::append((QString *)&local_d8);
          if (local_a0[0] != (QArrayData *)0x0) {
            LOCK();
            (local_a0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_a0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_a0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_a0[0],2,8);
            }
          }
          if (local_88 != (QArrayData *)0x0) {
            LOCK();
            (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_88,2,8);
            }
          }
          if (local_58 != (QArrayData *)0x0) {
            LOCK();
            (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_58,2,8);
            }
          }
          uVar5 = uVar5 + 1;
        } while ((long)uVar5 < (long)local_a8);
      }
      QClipboard::setText(local_60,&local_d8,0);
      goto LAB_001c1de4;
    }
    local_d8 = (QArrayData *)0x0;
    uStack_d0 = 0;
    local_c8 = 0;
    if (((((QArrayData *)local_b8._0_8_ == (QArrayData *)0x0) ||
         (1 < (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i)) &&
        (QByteArray::reallocData((longlong)local_b8,(AllocationOption)local_a8),
        (QArrayData *)local_b8._0_8_ == (QArrayData *)0x0)) ||
       (pcVar4 = (char *)local_b8._8_8_,
       1 < (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i)) {
      pcVar4 = (char *)local_b8._8_8_;
      QByteArray::reallocData((longlong)local_b8,(AllocationOption)local_a8);
    }
    if (pcVar4 != (char *)(local_b8._8_8_ + (long)local_a8)) {
      do {
        QString::number((uint)&local_88,(int)*pcVar4);
        QString::toUpper_helper((QString *)local_a0);
        QVar14.m_data = (storage_type *)0x2;
        QVar14.m_size = (qsizetype)&local_f8;
        QString::fromUtf8(QVar14);
        QString::append((QString *)&local_f8);
        QString::append((QString *)&local_d8);
        if (local_f8 != (QArrayData *)0x0) {
          LOCK();
          (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_f8,2,8);
          }
        }
        if (local_a0[0] != (QArrayData *)0x0) {
          LOCK();
          (local_a0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_a0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_a0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_a0[0],2,8);
          }
        }
        if (local_88 != (QArrayData *)0x0) {
          LOCK();
          (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_88,2,8);
          }
        }
        pcVar4 = pcVar4 + 1;
      } while (pcVar4 != (char *)(local_b8._8_8_ + (long)local_a8));
    }
    QVar15.m_data = (storage_type *)0x4;
    QVar15.m_size = (qsizetype)&local_f8;
    QString::fromUtf8(QVar15);
    local_88 = local_f8;
    uStack_80 = uStack_f0;
    local_78 = local_e8;
    QString::arg((QString *)local_a0,(int)&local_88,(QChar)(char16_t)&local_d8);
    QClipboard::setText(local_60,local_a0,0);
  }
  if (local_a0[0] != (QArrayData *)0x0) {
    LOCK();
    (local_a0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_a0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_a0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_a0[0],2,8);
    }
  }
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88,2,8);
    }
  }
LAB_001c1de4:
  if (local_d8 != (QArrayData *)0x0) {
    LOCK();
    (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_d8,2,8);
    }
  }
  if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b8._0_8_,1,8);
    }
  }
  return;
}

Assistant:

void QHexView::copyAs(CopyMode mode) const {
    QClipboard* c = qApp->clipboard();

    QByteArray bytes = m_hexcursor->hasSelection()
                           ? m_hexcursor->selectedBytes()
                           : m_hexdocument->read(m_hexcursor->offset(), 1);

    switch(mode) {
        case CopyMode::HexArrayCurly:
        case CopyMode::HexArraySquare: {
            QString hexchar;
            int i = 0;

            for(char b : bytes) {
                if(!hexchar.isEmpty()) {
                    hexchar += ", ";
                    if(m_options.copybreak && !(++i % m_options.linelength))
                        hexchar += "\n";
                }

                hexchar +=
                    "0x" + QString::number(static_cast<uint>(b), 16).toUpper();
            }

            c->setText(
                QString(mode == CopyMode::HexArraySquare ? "[%1]" : "{%1}")
                    .arg(hexchar));
            break;
        }

        case CopyMode::HexArrayChar: {
            QString hexchar;

            for(char b : bytes)
                hexchar +=
                    "\\x" + QString::number(static_cast<uint>(b), 16).toUpper();

            c->setText(QString("\"%1\"").arg(hexchar));
            break;
        }

        default: {
            QString hexchar;

            for(int i = 0; i < bytes.size(); i++) {
                if(!(i % m_options.grouplength)) {
                    if(!hexchar.isEmpty()) {
                        hexchar += ", ";
                        if(m_options.copybreak && !(i % m_options.linelength))
                            hexchar += "\n";
                    }

                    hexchar += "0x";
                }

                hexchar += QString("%1")
                               .arg(static_cast<uint>(bytes[i]), 2, 16,
                                    QLatin1Char('0'))
                               .toUpper();
            }

            c->setText(hexchar);
            break;
        }
    }
}